

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O2

string * __thiscall
cmExportTryCompileFileGenerator::GetFileSetFiles_abi_cxx11_
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,
          cmGeneratorTarget *param_1,cmFileSet *fileSet,cmTargetExport *param_3)

{
  WrapQuotes wrapQuotes;
  string_view str;
  string local_30;
  
  wrapQuotes = (WrapQuotes)param_3;
  cmList::
  to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
            (&local_30,&fileSet->FileEntries);
  str._M_str = (char *)0x0;
  str._M_len = (size_t)local_30._M_dataplus._M_p;
  cmOutputConverter::EscapeForCMake_abi_cxx11_
            (__return_storage_ptr__,(cmOutputConverter *)local_30._M_string_length,str,wrapQuotes);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::GetFileSetFiles(
  cmGeneratorTarget* /*gte*/, cmFileSet* fileSet, cmTargetExport* /*te*/)
{
  return cmOutputConverter::EscapeForCMake(
    cmList::to_string(fileSet->GetFileEntries()));
}